

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O0

void __thiscall
ExprFunctionAccess::ExprFunctionAccess
          (ExprFunctionAccess *this,SynBase *source,TypeBase *type,FunctionData *function,
          ExprBase *context)

{
  TypeBase *pTVar1;
  bool bVar2;
  InplaceStr local_40;
  ExprBase *local_30;
  ExprBase *context_local;
  FunctionData *function_local;
  TypeBase *type_local;
  SynBase *source_local;
  ExprFunctionAccess *this_local;
  
  local_30 = context;
  context_local = (ExprBase *)function;
  function_local = (FunctionData *)type;
  type_local = (TypeBase *)source;
  source_local = (SynBase *)this;
  ExprBase::ExprBase(&this->super_ExprBase,0x26,source,type);
  (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprFunctionAccess_0052bc88;
  this->function = (FunctionData *)context_local;
  this->context = local_30;
  if (local_30 == (ExprBase *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                  ,0x3ec,
                  "ExprFunctionAccess::ExprFunctionAccess(SynBase *, TypeBase *, FunctionData *, ExprBase *)"
                 );
  }
  pTVar1 = local_30->type;
  InplaceStr::InplaceStr(&local_40,"auto ref");
  bVar2 = InplaceStr::operator!=(&pTVar1->name,&local_40);
  if (bVar2) {
    if (((*(byte *)(*(long *)&context_local->listed + 0x3c) & 1) == 0) &&
       (((context_local->type->importModule == (ModuleData *)0x0 ||
         ((context_local->type->importModule->startingFunctionIndex & 1) == 0)) &&
        ((TypeBase *)context_local[1]._vptr_ExprBase != local_30->type)))) {
      __assert_fail("function->contextType == context->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                    ,0x3f1,
                    "ExprFunctionAccess::ExprFunctionAccess(SynBase *, TypeBase *, FunctionData *, ExprBase *)"
                   );
    }
    return;
  }
  __assert_fail("context->type->name != InplaceStr(\"auto ref\")",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                ,0x3ee,
                "ExprFunctionAccess::ExprFunctionAccess(SynBase *, TypeBase *, FunctionData *, ExprBase *)"
               );
}

Assistant:

ExprFunctionAccess(SynBase *source, TypeBase *type, FunctionData *function, ExprBase *context): ExprBase(myTypeID, source, type), function(function), context(context)
	{
		assert(context);

		assert(context->type->name != InplaceStr("auto ref"));

		if(!function->type->isGeneric && !(function->scope->ownerType && function->scope->ownerType->isGeneric))
			assert(function->contextType == context->type);
	}